

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

float google::protobuf::io::SafeDoubleToFloat(double value)

{
  float fVar1;
  double value_local;
  
  fVar1 = std::numeric_limits<float>::max();
  if (value <= (double)fVar1) {
    fVar1 = std::numeric_limits<float>::max();
    if ((double)-fVar1 <= value) {
      value_local._4_4_ = (float)value;
    }
    else {
      fVar1 = std::numeric_limits<float>::infinity();
      value_local._4_4_ = -fVar1;
    }
  }
  else {
    value_local._4_4_ = std::numeric_limits<float>::infinity();
  }
  return value_local._4_4_;
}

Assistant:

float SafeDoubleToFloat(double value) {
  if (value > std::numeric_limits<float>::max()) {
    return std::numeric_limits<float>::infinity();
  } else if (value < -std::numeric_limits<float>::max()) {
    return -std::numeric_limits<float>::infinity();
  } else {
    return static_cast<float>(value);
  }
}